

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_resize(lua_State *L,int nsize)

{
  int osize_00;
  global_State *pgVar1;
  stringtable *psVar2;
  TString **vect;
  TString **newvect;
  int osize;
  stringtable *tb;
  int nsize_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  psVar2 = &pgVar1->strt;
  osize_00 = (pgVar1->strt).size;
  if (nsize < osize_00) {
    tablerehash(psVar2->hash,osize_00,nsize);
  }
  vect = (TString **)luaM_realloc_(L,psVar2->hash,(long)osize_00 << 3,(long)nsize << 3);
  if (vect == (TString **)0x0) {
    if (nsize < osize_00) {
      tablerehash(psVar2->hash,nsize,osize_00);
    }
  }
  else {
    psVar2->hash = vect;
    (pgVar1->strt).size = nsize;
    if (osize_00 < nsize) {
      tablerehash(vect,osize_00,nsize);
    }
  }
  return;
}

Assistant:

void luaS_resize (lua_State *L, int nsize) {
  stringtable *tb = &G(L)->strt;
  int osize = tb->size;
  TString **newvect;
  if (nsize < osize)  /* shrinking table? */
    tablerehash(tb->hash, osize, nsize);  /* depopulate shrinking part */
  newvect = luaM_reallocvector(L, tb->hash, osize, nsize, TString*);
  if (l_unlikely(newvect == NULL)) {  /* reallocation failed? */
    if (nsize < osize)  /* was it shrinking table? */
      tablerehash(tb->hash, nsize, osize);  /* restore to original size */
    /* leave table as it was */
  }
  else {  /* allocation succeeded */
    tb->hash = newvect;
    tb->size = nsize;
    if (nsize > osize)
      tablerehash(newvect, osize, nsize);  /* rehash for new size */
  }
}